

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_clock_constraint
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *first,typed_expression_t *second,ineq_cmp_t cmp,
          typed_expression_t *bound)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  iterator iVar2;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  clocks_compiler;
  ulong local_40;
  undefined **local_38;
  vector<long,_std::allocator<long>_> *local_30;
  
  local_30 = (this->_bytecode_back_inserter).container;
  local_38 = &PTR__typed_expression_visitor_t_00216308;
  (**(code **)(*(long *)first + 0x30))(first,&local_38);
  (**(code **)(*(long *)second + 0x30))(second,&local_38);
  (**(code **)(*(long *)bound + 0x30))(bound,this);
  local_40 = 0x16;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_40);
  }
  else {
    *iVar2._M_current = 0x16;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_40 = (ulong)cmp;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_40 = 5;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_40);
  }
  else {
    *iVar2._M_current = 5;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_40 = 1;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_40);
  }
  else {
    *iVar2._M_current = 1;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void compile_clock_constraint(tchecker::typed_expression_t const & first, tchecker::typed_expression_t const & second,
                                enum tchecker::ineq_cmp_t cmp, tchecker::typed_expression_t const & bound)
  {
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> clocks_compiler(_bytecode_back_inserter);

    first.visit(clocks_compiler);
    second.visit(clocks_compiler);
    bound.visit(*this);
    _bytecode_back_inserter = tchecker::VM_CLKCONSTR;
    _bytecode_back_inserter = cmp;
    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = 1;
  }